

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_midi.c
# Opt level: O0

void inmidi_controlchange(int portno,int channel,int ctlnumber,int value)

{
  undefined1 local_48 [8];
  t_atom at [3];
  int value_local;
  int ctlnumber_local;
  int channel_local;
  int portno_local;
  
  if (*(long *)(*(long *)(pd_maininstance.pd_midi + 0x18) + 8) != 0) {
    local_48._0_4_ = A_FLOAT;
    at[0].a_type = (t_atomtype)(float)ctlnumber;
    at[0].a_w.w_float = 1.4013e-45;
    at[1].a_type = (t_atomtype)(float)value;
    at[1].a_w.w_float = 1.4013e-45;
    at[2].a_type = (t_atomtype)(float)(channel + portno * 0x10 + 1);
    at[2].a_w._0_4_ = value;
    at[2].a_w._4_4_ = ctlnumber;
    pd_list(*(t_pd **)(*(long *)(pd_maininstance.pd_midi + 0x18) + 8),&s_list,3,(t_atom *)local_48);
  }
  return;
}

Assistant:

void inmidi_controlchange(int portno, int channel, int ctlnumber, int value)
{
    if (pd_this->pd_midi->m_ctlin_sym->s_thing)
    {
        t_atom at[3];
        SETFLOAT(at, ctlnumber);
        SETFLOAT(at+1, value);
        SETFLOAT(at+2, (channel + (portno << 4) + 1));
        pd_list(pd_this->pd_midi->m_ctlin_sym->s_thing, &s_list, 3, at);
    }
}